

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O3

int archive_write_client_write(archive_write_filter *f,void *_buff,size_t length)

{
  ulong *puVar1;
  archive *a;
  ulong *puVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  
  a = f->archive;
  puVar2 = (ulong *)f->data;
  uVar7 = *puVar2;
  if (uVar7 == 0) {
    if (0 < (long)length) {
      do {
        lVar5 = (**(code **)&a[1].file_count)(a,a[1].error_string.s,_buff);
        if (lVar5 < 1) {
          return -0x1e;
        }
        _buff = (void *)((long)_buff + lVar5);
        sVar6 = length - lVar5;
        bVar3 = lVar5 <= (long)length;
        length = sVar6;
      } while (sVar6 != 0 && bVar3);
    }
  }
  else {
    uVar8 = puVar2[1];
    if (uVar8 < uVar7) {
      if (length <= uVar8) {
        uVar8 = length;
      }
      memcpy((void *)puVar2[3],_buff,uVar8);
      puVar2[3] = puVar2[3] + uVar8;
      _buff = (void *)((long)_buff + uVar8);
      length = length - uVar8;
      puVar1 = puVar2 + 1;
      *puVar1 = *puVar1 - uVar8;
      uVar7 = *puVar2;
      if (*puVar1 == 0) {
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar8 = puVar2[2];
          do {
            uVar4 = (**(code **)&a[1].file_count)(a,a[1].error_string.s,uVar8,uVar7);
            if ((long)uVar4 < 1) {
              return -0x1e;
            }
            if (uVar7 < uVar4) {
              archive_set_error(a,-1,"write overrun");
              return -0x1e;
            }
            uVar8 = uVar8 + uVar4;
            uVar7 = uVar7 - uVar4;
          } while (uVar7 != 0);
          uVar7 = *puVar2;
        }
        puVar2[3] = puVar2[2];
        puVar2[1] = uVar7;
      }
    }
    while (uVar7 <= length) {
      lVar5 = (**(code **)&a[1].file_count)(a,a[1].error_string.s,_buff);
      if (lVar5 < 1) {
        return -0x1e;
      }
      _buff = (void *)((long)_buff + lVar5);
      length = length - lVar5;
      uVar7 = *puVar2;
    }
    if (0 < (long)length) {
      memcpy((void *)puVar2[3],_buff,length);
      puVar2[3] = puVar2[3] + length;
      puVar2[1] = puVar2[1] - length;
    }
  }
  return 0;
}

Assistant:

static int
archive_write_client_write(struct archive_write_filter *f,
    const void *_buff, size_t length)
{
	struct archive_write *a = (struct archive_write *)f->archive;
        struct archive_none *state = (struct archive_none *)f->data;
	const char *buff = (const char *)_buff;
	ssize_t remaining, to_copy;
	ssize_t bytes_written;

	remaining = length;

	/*
	 * If there is no buffer for blocking, just pass the data
	 * straight through to the client write callback.  In
	 * particular, this supports "no write delay" operation for
	 * special applications.  Just set the block size to zero.
	 */
	if (state->buffer_size == 0) {
		while (remaining > 0) {
			bytes_written = (a->client_writer)(&a->archive,
			    a->client_data, buff, remaining);
			if (bytes_written <= 0)
				return (ARCHIVE_FATAL);
			remaining -= bytes_written;
			buff += bytes_written;
		}
		return (ARCHIVE_OK);
	}

	/* If the copy buffer isn't empty, try to fill it. */
	if (state->avail < state->buffer_size) {
		/* If buffer is not empty... */
		/* ... copy data into buffer ... */
		to_copy = ((size_t)remaining > state->avail) ?
			state->avail : (size_t)remaining;
		memcpy(state->next, buff, to_copy);
		state->next += to_copy;
		state->avail -= to_copy;
		buff += to_copy;
		remaining -= to_copy;
		/* ... if it's full, write it out. */
		if (state->avail == 0) {
			char *p = state->buffer;
			size_t to_write = state->buffer_size;
			while (to_write > 0) {
				bytes_written = (a->client_writer)(&a->archive,
				    a->client_data, p, to_write);
				if (bytes_written <= 0)
					return (ARCHIVE_FATAL);
				if ((size_t)bytes_written > to_write) {
					archive_set_error(&(a->archive),
					    -1, "write overrun");
					return (ARCHIVE_FATAL);
				}
				p += bytes_written;
				to_write -= bytes_written;
			}
			state->next = state->buffer;
			state->avail = state->buffer_size;
		}
	}

	while ((size_t)remaining >= state->buffer_size) {
		/* Write out full blocks directly to client. */
		bytes_written = (a->client_writer)(&a->archive,
		    a->client_data, buff, state->buffer_size);
		if (bytes_written <= 0)
			return (ARCHIVE_FATAL);
		buff += bytes_written;
		remaining -= bytes_written;
	}

	if (remaining > 0) {
		/* Copy last bit into copy buffer. */
		memcpy(state->next, buff, remaining);
		state->next += remaining;
		state->avail -= remaining;
	}
	return (ARCHIVE_OK);
}